

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNamedNodeMapImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMNamedNodeMapImpl::setReadOnly(DOMNamedNodeMapImpl *this,bool readOnl,bool deep)

{
  XMLSize_t XVar1;
  DOMNode *p;
  DOMNodeImpl *this_00;
  XMLSize_t local_30;
  XMLSize_t i;
  XMLSize_t sz;
  XMLSize_t index;
  bool deep_local;
  bool readOnl_local;
  DOMNamedNodeMapImpl *this_local;
  
  if (deep) {
    for (sz = 0; sz < 0xc1; sz = sz + 1) {
      if (this->fBuckets[sz] != (DOMNodeVector *)0x0) {
        XVar1 = DOMNodeVector::size(this->fBuckets[sz]);
        for (local_30 = 0; local_30 < XVar1; local_30 = local_30 + 1) {
          p = DOMNodeVector::elementAt(this->fBuckets[sz],local_30);
          this_00 = xercesc_4_0::castToNodeImpl(p);
          DOMNodeImpl::setReadOnly(this_00,readOnl,deep);
        }
      }
    }
  }
  return;
}

Assistant:

void DOMNamedNodeMapImpl::setReadOnly(bool readOnl, bool deep)
{
    // this->fReadOnly=readOnl;
    if(deep) {
        for (XMLSize_t index = 0; index < MAP_SIZE; index++) {
            if(fBuckets[index]==0)
                continue;
            XMLSize_t sz = fBuckets[index]->size();
            for (XMLSize_t i=0; i<sz; ++i)
                castToNodeImpl(fBuckets[index]->elementAt(i))->setReadOnly(readOnl, deep);
        }
    }
}